

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  byte bVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  BYTE wksp [512];
  ulong local_2b0;
  short local_2a8 [56];
  undefined1 local_238 [520];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < nbSeq || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  bVar6 = (byte)defaultNormLog;
  if (strategy < ZSTD_lazy) {
    if (isDefaultAllowed == ZSTD_defaultDisallowed) goto LAB_004d96dc;
    if ((nbSeq < 1000) && (*repeatMode == FSE_repeat_valid)) {
      bVar3 = false;
      mostFrequent = 3;
    }
    else {
      if ((nbSeq < ((ulong)(10 - strategy) << (bVar6 & 0x3f)) >> 3) ||
         (mostFrequent < nbSeq >> (bVar6 - 1 & 0x3f))) goto LAB_004d96ce;
      bVar3 = true;
    }
  }
  else {
    local_2b0 = 0xffffffffffffffff;
    uVar13 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      uVar11 = 0;
      uVar13 = 0;
      do {
        sVar7 = defaultNorm[uVar11];
        if (defaultNorm[uVar11] == -1) {
          sVar7 = 1;
        }
        uVar13 = uVar13 + kInverseProbabiltyLog256[(uint)((int)sVar7 << (8 - bVar6 & 0x1f))] *
                          count[uVar11];
        uVar11 = uVar11 + 1;
      } while (max + 1 + (uint)(max == 0xffffffff) != uVar11);
      uVar13 = uVar13 >> 8;
    }
    if (*repeatMode != FSE_repeat_none) {
      uVar1 = (ushort)*prevCTable;
      bVar6 = (byte)uVar1;
      lVar10 = 1;
      if (uVar1 != 0) {
        lVar10 = (long)(1 << (bVar6 - 1 & 0x1f));
      }
      if (max <= *(ushort *)((long)prevCTable + 2)) {
        uVar12 = 0;
        uVar11 = 0;
        do {
          iVar8 = (prevCTable[lVar10 + uVar12 * 2 + 2] >> 0x10) + 1;
          if (count[uVar12] == 0) {
            bVar3 = false;
          }
          else {
            uVar9 = iVar8 * 0x100 -
                    (iVar8 * 0x1000000 +
                     (prevCTable[lVar10 + uVar12 * 2 + 2] + (1 << (bVar6 & 0x1f))) * -0x100 >>
                    (bVar6 & 0x1f));
            bVar3 = true;
            if (uVar9 < (uint)uVar1 * 0x100 + 0x100) {
              uVar11 = uVar11 + uVar9 * count[uVar12];
              bVar3 = false;
            }
          }
          if (bVar3) goto LAB_004d95e3;
          uVar12 = uVar12 + 1;
        } while (max + 1 != uVar12);
        local_2b0 = uVar11 >> 8;
      }
    }
LAB_004d95e3:
    uVar9 = FSE_optimalTableLog(FSELog,nbSeq,max);
    sVar4 = FSE_normalizeCount(local_2a8,uVar9,count,nbSeq,max);
    if (sVar4 < 0xffffffffffffff89) {
      sVar4 = FSE_writeNCount(local_238,0x200,local_2a8,max,uVar9);
    }
    uVar11 = 0;
    uVar9 = 0;
    do {
      uVar2 = count[uVar11];
      uVar5 = (uVar2 << 8) / nbSeq;
      uVar12 = uVar5;
      if (uVar2 << 8 < nbSeq) {
        uVar12 = 1;
      }
      if (uVar2 == 0) {
        uVar12 = uVar5;
      }
      uVar9 = uVar9 + uVar2 * kInverseProbabiltyLog256[uVar12];
      uVar11 = uVar11 + 1;
    } while (max + 1 + (uint)(max == 0xffffffff) != uVar11);
    uVar11 = (ulong)(uVar9 >> 8) + sVar4 * 8;
    if ((local_2b0 < uVar13) || (uVar11 < uVar13)) {
      bVar3 = uVar11 < local_2b0;
      mostFrequent = 3;
    }
    else {
LAB_004d96ce:
      *repeatMode = FSE_repeat_none;
      bVar3 = false;
      mostFrequent = 0;
    }
  }
  if (!bVar3) {
    return (symbolEncodingType_e)mostFrequent;
  }
LAB_004d96dc:
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

MEM_STATIC symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or less symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}